

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo.cpp
# Opt level: O0

void __thiscall QHostInfoCache::QHostInfoCache(QHostInfoCache *this)

{
  QCache<QString,_QHostInfoCache::QHostInfoCacheElement> *in_RDI;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffef;
  
  *(undefined4 *)&(in_RDI->chain).prev = 0x3c;
  std::atomic<bool>::atomic((atomic<bool> *)in_RDI,(bool)in_stack_ffffffffffffffef);
  QCache<QString,_QHostInfoCache::QHostInfoCacheElement>::QCache
            (in_RDI,CONCAT17(in_stack_ffffffffffffffef,in_stack_ffffffffffffffe8));
  QMutex::QMutex((QMutex *)0x21f11c);
  return;
}

Assistant:

QHostInfoCache::QHostInfoCache() : max_age(60), enabled(true), cache(128)
{
#ifdef QT_QHOSTINFO_CACHE_DISABLED_BY_DEFAULT
    enabled.store(false, std::memory_order_relaxed);
#endif
}